

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonIterativeFeaturePreservingMeshFiltering.cpp
# Opt level: O1

void __thiscall
NonIterativeFeaturePreservingMeshFiltering::mollifiedNormals
          (NonIterativeFeaturePreservingMeshFiltering *this,TriMesh *mesh,
          vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          *face_centroid,vector<double,_std::allocator<double>_> *face_area,double sigma_f,
          vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          *mollified_normals)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  pointer pVVar6;
  double dVar7;
  value_handle _idx;
  value_handle _idx_00;
  int iVar8;
  BaseHandle _idx_01;
  PropertyT<OpenMesh::VectorT<double,_3>_> *pPVar9;
  reference pvVar10;
  undefined4 extraout_var;
  size_type __new_size;
  const_reference pvVar11;
  long lVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  VertexIter VVar16;
  FaceIter FVar17;
  undefined1 local_300 [8];
  TriMesh temp_mesh;
  undefined1 local_80 [8];
  VertexIter v_it;
  undefined1 auStack_68 [8];
  vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> vertex_face_neighbor;
  double local_48;
  double local_40;
  double local_38;
  
  OpenMesh::ArrayKernel::ArrayKernel((ArrayKernel *)local_300,(ArrayKernel *)mesh);
  local_300 = (undefined1  [8])&PTR__PolyConnectivity_001c2570;
  std::
  vector<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
  ::vector((vector<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
            *)&temp_mesh.super_Mesh.
               super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
               .
               super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
               .field_0x168,
           (vector<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
            *)&(mesh->super_Mesh).
               super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
               .
               super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
               .field_0x170);
  std::
  vector<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>,_std::allocator<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>_>_>
  ::vector((vector<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>,_std::allocator<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>_>_>
            *)&temp_mesh.super_Mesh.
               super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
               .
               super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
               .field_0x180,
           (vector<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>,_std::allocator<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>_>_>
            *)&(mesh->super_Mesh).
               super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
               .
               super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
               .field_0x188);
  temp_mesh.super_Mesh.
  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
  .super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>._408_4_
       = *(undefined4 *)
          &(mesh->super_Mesh).
           super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
           .
           super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
           .field_0x1a0;
  local_300 = (undefined1  [8])&PTR__PolyConnectivity_001c2530;
  memcpy(&temp_mesh.super_Mesh.
          super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
          .super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
          .field_0x19c,
         &(mesh->super_Mesh).
          super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
          .super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
          .points_,0x84);
  local_300 = (undefined1  [8])&PTR__PolyConnectivity_001c2450;
  _local_80 = OpenMesh::PolyConnectivity::vertices_begin((PolyConnectivity *)mesh);
  while( true ) {
    VVar16 = OpenMesh::PolyConnectivity::vertices_end((PolyConnectivity *)mesh);
    _idx.super_BaseHandle.idx_ = v_it.mesh_._0_4_;
    if (v_it.mesh_._0_4_ == (BaseHandle)VVar16.hnd_.super_BaseHandle.idx_ &&
        local_80 == (undefined1  [8])VVar16.mesh_) break;
    pPVar9 = OpenMesh::PropertyContainer::property<OpenMesh::VectorT<double,3>>
                       ((PropertyContainer *)
                        &(mesh->super_Mesh).
                         super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                         .
                         super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                         .field_0x8,
                        (BasePropHandleT<OpenMesh::VectorT<double,_3>_>)
                        (mesh->super_Mesh).
                        super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                        .
                        super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                        .points_.super_BasePropHandleT<OpenMesh::VectorT<double,_3>_>.
                        super_BaseHandle.idx_);
    pvVar10 = OpenMesh::PropertyT<OpenMesh::VectorT<double,_3>_>::operator[]
                        (pPVar9,(int)_idx.super_BaseHandle.idx_);
    dVar1 = (pvVar10->super_VectorDataT<double,_3>).values_[0];
    dVar2 = (pvVar10->super_VectorDataT<double,_3>).values_[1];
    dVar3 = (pvVar10->super_VectorDataT<double,_3>).values_[2];
    _auStack_68 = (FaceIter)ZEXT816(0);
    vertex_face_neighbor.
    super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    getVertexFaceNeighbor
              (this,mesh,face_centroid,(VertexHandle)v_it.mesh_._0_4_,sigma_f,
               (vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)auStack_68);
    if ((int)((ulong)((long)vertex_face_neighbor.
                            super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                            ._M_impl.super__Vector_impl_data._M_start - (long)auStack_68) >> 2) < 1)
    {
      v_it.hnd_.super_BaseHandle.idx_ = (BaseHandle)0x0;
      v_it.skip_bits_ = 0;
      local_38 = 0.0;
      local_40 = 0.0;
      local_48 = 0.0;
    }
    else {
      local_48 = 0.0;
      lVar12 = 0;
      local_40 = 0.0;
      local_38 = 0.0;
      v_it.hnd_.super_BaseHandle.idx_ = (BaseHandle)0x0;
      v_it.skip_bits_ = 0;
      do {
        iVar8 = *(int *)((long)&(((mesh_ptr)auStack_68)->super_ArrayKernel).super_BaseKernel.
                                _vptr_BaseKernel + lVar12 * 4);
        pVVar6 = (face_centroid->
                 super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        dVar4 = pVVar6[iVar8].super_VectorDataT<double,_3>.values_[0];
        dVar5 = pVVar6[iVar8].super_VectorDataT<double,_3>.values_[1];
        temp_mesh.super_Mesh.
        super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
        .super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>.
        _544_8_ = pVVar6[iVar8].super_VectorDataT<double,_3>.values_[2];
        dVar14 = dVar4 - dVar1;
        dVar15 = dVar5 - dVar2;
        dVar7 = (double)temp_mesh.super_Mesh.
                        super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                        .
                        super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                        ._544_8_ - dVar3;
        dVar7 = dVar7 * dVar7 + dVar14 * dVar14 + dVar15 * dVar15;
        if (dVar7 < 0.0) {
          dVar7 = sqrt(dVar7);
        }
        else {
          dVar7 = SQRT(dVar7);
        }
        dVar14 = exp((dVar7 * -0.5 * dVar7) / (sigma_f * 0.5 * sigma_f * 0.5));
        dVar7 = (face_area->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start
                [*(int *)((long)&(((ArrayKernel *)auStack_68)->super_BaseKernel)._vptr_BaseKernel +
                         lVar12 * 4)];
        local_38 = local_38 + dVar4 * dVar7 * dVar14;
        local_40 = local_40 + dVar5 * dVar7 * dVar14;
        local_48 = local_48 +
                   (double)temp_mesh.super_Mesh.
                           super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                           .
                           super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                           ._544_8_ * dVar7 * dVar14;
        v_it._8_8_ = (double)v_it._8_8_ + dVar7 * dVar14;
        lVar12 = lVar12 + 1;
      } while (lVar12 < (int)((ulong)((long)vertex_face_neighbor.
                                            super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                            ._M_impl.super__Vector_impl_data._M_start -
                                     (long)auStack_68) >> 2));
    }
    uVar13 = (ulong)(uint)v_it.mesh_._0_4_;
    iVar8 = (**(_func_int **)((long)local_300 + 0x10))(local_300);
    _idx_01.idx_ = -1;
    if (uVar13 < CONCAT44(extraout_var,iVar8)) {
      _idx_01.idx_ = (int)OpenMesh::ArrayKernel::handle
                                    ((ArrayKernel *)local_300,
                                     (Vertex *)
                                     (uVar13 * 4 +
                                     temp_mesh.super_Mesh.
                                     super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                     .
                                     super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                     ._160_8_));
    }
    local_38 = local_38 / (double)v_it._8_8_;
    local_40 = local_40 / (double)v_it._8_8_;
    local_48 = local_48 / (double)v_it._8_8_;
    pPVar9 = OpenMesh::PropertyContainer::property<OpenMesh::VectorT<double,3>>
                       ((PropertyContainer *)&temp_mesh,
                        (BasePropHandleT<OpenMesh::VectorT<double,_3>_>)
                        temp_mesh.super_Mesh.
                        super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                        .
                        super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                        ._412_4_);
    pvVar10 = OpenMesh::PropertyT<OpenMesh::VectorT<double,_3>_>::operator[](pPVar9,_idx_01.idx_);
    (pvVar10->super_VectorDataT<double,_3>).values_[0] = local_38;
    (pvVar10->super_VectorDataT<double,_3>).values_[1] = local_40;
    (pvVar10->super_VectorDataT<double,_3>).values_[2] = local_48;
    if (auStack_68 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_68);
    }
    v_it.mesh_._0_4_ = (BaseHandle)(BaseHandle)((int)v_it.mesh_._0_4_ + 1);
    if (v_it.mesh_._4_4_ != 0) {
      OpenMesh::Iterators::
      GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
      ::skip_fwd((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                  *)local_80);
    }
  }
  __new_size = (**(code **)(*(long *)&(mesh->super_Mesh).
                                      super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                      .
                                      super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                           + 0x28))(mesh);
  std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::resize
            (mollified_normals,__new_size);
  OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
  request_face_normals
            ((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity> *)
             local_300);
  OpenMesh::
  PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
  ::update_face_normals
            ((PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
              *)local_300);
  _auStack_68 = OpenMesh::PolyConnectivity::faces_begin((PolyConnectivity *)local_300);
  while( true ) {
    FVar17 = OpenMesh::PolyConnectivity::faces_end((PolyConnectivity *)local_300);
    _idx_00.super_BaseHandle.idx_ =
         vertex_face_neighbor.
         super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
         super__Vector_impl_data._M_start._0_4_;
    if (vertex_face_neighbor.
        super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ == (BaseHandle)FVar17.hnd_.super_BaseHandle.idx_ &&
        auStack_68 == (undefined1  [8])FVar17.mesh_) break;
    pPVar9 = OpenMesh::PropertyContainer::property<OpenMesh::VectorT<double,3>>
                       ((PropertyContainer *)
                        &temp_mesh.super_Mesh.
                         super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                         .
                         super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                         .field_0x60,
                        (BasePropHandleT<OpenMesh::VectorT<double,_3>_>)
                        temp_mesh.super_Mesh.
                        super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                        .
                        super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                        .halfedge_colors_.
                        super_BasePropHandleT<OpenMesh::VectorT<unsigned_char,_3>_>.super_BaseHandle
                        .idx_);
    pvVar11 = OpenMesh::PropertyT<OpenMesh::VectorT<double,_3>_>::operator[]
                        (pPVar9,(int)_idx_00.super_BaseHandle.idx_);
    pVVar6 = (mollified_normals->
             super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pVVar6[(int)vertex_face_neighbor.
                super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
                _M_impl.super__Vector_impl_data._M_start._0_4_].super_VectorDataT<double,_3>.values_
    [2] = (pvVar11->super_VectorDataT<double,_3>).values_[2];
    dVar1 = (pvVar11->super_VectorDataT<double,_3>).values_[1];
    pVVar6 = pVVar6 + (int)vertex_face_neighbor.
                           super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                           ._M_impl.super__Vector_impl_data._M_start._0_4_;
    (pVVar6->super_VectorDataT<double,_3>).values_[0] =
         (pvVar11->super_VectorDataT<double,_3>).values_[0];
    (pVVar6->super_VectorDataT<double,_3>).values_[1] = dVar1;
    vertex_face_neighbor.
    super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ =
         (BaseHandle)
         (BaseHandle)
         ((int)vertex_face_neighbor.
               super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
               _M_impl.super__Vector_impl_data._M_start._0_4_ + 1);
    if (vertex_face_neighbor.
        super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
        super__Vector_impl_data._M_start._4_4_ != 0) {
      OpenMesh::Iterators::
      GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
      ::skip_fwd((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                  *)auStack_68);
    }
  }
  OpenMesh::PolyConnectivity::~PolyConnectivity((PolyConnectivity *)local_300);
  return;
}

Assistant:

void NonIterativeFeaturePreservingMeshFiltering::mollifiedNormals(TriMesh &mesh, std::vector<TriMesh::Point> &face_centroid, std::vector<double> &face_area, double sigma_f,
                                                                  std::vector<TriMesh::Normal> &mollified_normals)
{
    TriMesh temp_mesh = mesh;

    double sigma_m = sigma_f / 2.0;

    for(TriMesh::VertexIter v_it = mesh.vertices_begin(); v_it != mesh.vertices_end(); v_it++)
    {
        TriMesh::Point pt = mesh.point(*v_it);

        std::vector<TriMesh::FaceHandle> vertex_face_neighbor;
        getVertexFaceNeighbor(mesh, face_centroid, *v_it, sigma_f, vertex_face_neighbor);

        TriMesh::Point new_point(0.0, 0.0, 0.0);
        double weight_sum = 0.0;
        for(int i = 0; i < (int)vertex_face_neighbor.size(); i++)
        {
            TriMesh::Point centroid = face_centroid[vertex_face_neighbor[i].idx()];

            double dis = (centroid - pt).length();
            double weight = std::exp(- 0.5 * dis * dis / (sigma_m * sigma_m));

            double area = face_area[vertex_face_neighbor[i].idx()];
            new_point += centroid * area * weight;
            weight_sum += area * weight;
        }
        new_point /= weight_sum;

        int vertex_index = (*v_it).idx();
        TriMesh::VertexHandle vh = temp_mesh.vertex_handle(vertex_index);
        temp_mesh.set_point(vh, new_point);
    }

    mollified_normals.resize(mesh.n_faces());
    temp_mesh.request_face_normals();
    temp_mesh.update_face_normals();
    for(TriMesh::FaceIter f_it = temp_mesh.faces_begin(); f_it != temp_mesh.faces_end(); f_it++)
        mollified_normals[(*f_it).idx()] = temp_mesh.normal(*f_it);
}